

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

pcut_item_t * pcut_get_real(pcut_item_t *item)

{
  if (item == (pcut_item_t *)0x0) {
    item = (pcut_item_t *)0x0;
  }
  else if (item->kind == 0) {
    if (item != (pcut_item_t *)0x0) {
      while( true ) {
        item = item->next;
        if (item == (pcut_item_t *)0x0) break;
        if (item->kind != 0) {
          return item;
        }
      }
    }
    return (pcut_item_t *)0x0;
  }
  return item;
}

Assistant:

pcut_item_t *pcut_get_real(pcut_item_t *item) {
	if (item == NULL) {
		return NULL;
	}

	if (item->kind == PCUT_KIND_SKIP) {
		return pcut_get_real_next(item);
	} else {
		return item;
	}
}